

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_memory.cpp
# Opt level: O2

Object * __thiscall LiteScript::_BasicMemory_1::CreateAt(_BasicMemory_1 *this,uint id)

{
  _BasicMemory_0 *this_00;
  Object *pOVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = id >> 8;
  this_00 = (this->arr)._M_elems[uVar3];
  if (this_00 == (_BasicMemory_0 *)0x0) {
    this_00 = (_BasicMemory_0 *)operator_new(0x2f20);
    _BasicMemory_0::_BasicMemory_0(this_00,this->memory);
    (this->arr)._M_elems[uVar3] = this_00;
    (this->nfull)._M_elems[uVar3] = this->first_nfull;
    this->first_nfull = (short)(id >> 8);
  }
  pOVar1 = _BasicMemory_0::CreateAt(this_00,id);
  this->count = this->count + 1;
  if ((this->arr)._M_elems[uVar3]->count == 0x100) {
    for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
      if (uVar3 == (int)(this->nfull)._M_elems[lVar2]) {
        (this->nfull)._M_elems[lVar2] = (this->nfull)._M_elems[uVar3];
        return pOVar1;
      }
    }
    this->first_nfull = (this->nfull)._M_elems[uVar3];
  }
  return pOVar1;
}

Assistant:

LiteScript::Object& LiteScript::_BasicMemory_1::CreateAt(unsigned int id) {
    unsigned int block = id >> 8;
    if (this->arr[block] == nullptr) {
        this->arr[block] = new LiteScript::_BasicMemory_0(this->memory);
        this->nfull[block] = this->first_nfull;
        this->first_nfull = (short)block;
    }
    Object& obj = this->arr[block]->CreateAt(id);
    this->count++;
    if (this->arr[block]->isFull()) {
        unsigned int j;
        for (j = 0; j < LITESCRIPT_MEMORY_1_SIZE && this->nfull[j] != block; j++);
        if (j == LITESCRIPT_MEMORY_1_SIZE)
            this->first_nfull = this->nfull[block];
        else
            this->nfull[j] = this->nfull[block];
    }
    return obj;
}